

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

essentials_t *
opengv::relative_pose::sevenpt
          (RelativeAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices)

{
  Indices *in_RDI;
  Indices idx;
  Indices *in_stack_00000e80;
  RelativeAdapterBase *in_stack_00000e88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  
  Indices::Indices(in_RDI,in_stack_ffffffffffffffb8);
  sevenpt(in_stack_00000e88,in_stack_00000e80);
  return (essentials_t *)in_RDI;
}

Assistant:

opengv::essentials_t
opengv::relative_pose::sevenpt(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  Indices idx(indices);
  return sevenpt(adapter,idx);
}